

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O2

void __thiscall
QHashPrivate::Node<QString,QtInstallDirectoryWithTriple>::
emplaceValue<QtInstallDirectoryWithTriple_const&>
          (Node<QString,QtInstallDirectoryWithTriple> *this,QtInstallDirectoryWithTriple *args)

{
  long in_FS_OFFSET;
  QtInstallDirectoryWithTriple QStack_58;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  QtInstallDirectoryWithTriple::QtInstallDirectoryWithTriple(&QStack_58,args);
  QtInstallDirectoryWithTriple::operator=((QtInstallDirectoryWithTriple *)(this + 0x18),&QStack_58);
  QtInstallDirectoryWithTriple::~QtInstallDirectoryWithTriple(&QStack_58);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplaceValue(Args &&... args)
    {
        value = T(std::forward<Args>(args)...);
    }